

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall
SharedPtrTests_base_Constructor_Test::TestBody(SharedPtrTests_base_Constructor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_c8;
  AssertHelper local_a8;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_;
  Message local_80;
  int *local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  Message local_58;
  int local_50 [4];
  size_t local_40;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  SharedPtr<int> testingPtr;
  int *a;
  SharedPtrTests_base_Constructor_Test *this_local;
  
  testingPtr.pointersAmount = (atomic<unsigned_long> *)operator_new(4);
  *(int *)&((testingPtr.pointersAmount)->super___atomic_base<unsigned_long>)._M_i = 4;
  SharedPtr<int>::SharedPtr((SharedPtr<int> *)&gtest_ar.message_,(int *)testingPtr.pointersAmount);
  local_40 = SharedPtr<int>::use_count((SharedPtr<int> *)&gtest_ar.message_);
  local_50[0] = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_38,"testingPtr.use_count()","1",&local_40,local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0x13,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  local_78 = SharedPtr<int>::get((SharedPtr<int> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<int*,int*>
            ((EqHelper<false> *)local_70,"testingPtr.get()","a",&local_78,
             (int **)&testingPtr.pointersAmount);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0x14,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  testing::AssertionResult::AssertionResult<SharedPtr<int>>
            ((AssertionResult *)local_98,(SharedPtr<int> *)&gtest_ar.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_98,(AssertionResult *)0x14d0b8,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0x15,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  SharedPtr<int>::~SharedPtr((SharedPtr<int> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(SharedPtrTests_base,Constructor) {
	int* a;
	a = new int;
	*a = 4;
	SharedPtr<int> testingPtr(a);
	EXPECT_EQ(testingPtr.use_count(),1);
	EXPECT_EQ(testingPtr.get(), a);
	EXPECT_TRUE(testingPtr);
}